

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_write.cpp
# Opt level: O3

void __thiscall
ritobin::io::text_write_impl::TextWriter::write<unsigned_short>
          (TextWriter *this,unsigned_short value)

{
  __integer_to_chars_result_type<unsigned_short> _Var1;
  string result;
  char buffer [256];
  undefined1 *local_168;
  long local_160;
  undefined1 local_158;
  undefined7 uStack_157;
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  char local_128 [256];
  char local_28 [8];
  
  local_160 = 0;
  local_158 = 0;
  local_168 = &local_158;
  memset(local_128,0,0x100);
  _Var1 = std::__to_chars_i<unsigned_short>(local_128,local_28,value,10);
  if (_Var1.ec == 0) {
    local_148[0] = local_138;
    std::__cxx11::string::_M_construct<char*>((string *)local_148,local_128,_Var1.ptr);
    write<unsigned_short>((int)&local_168,local_148,(size_t)local_138);
  }
  std::vector<char,std::allocator<char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((vector<char,std::allocator<char>> *)this->buffer_,
             *(undefined8 *)((vector<char,std::allocator<char>> *)this->buffer_ + 8),local_168,
             local_168 + local_160);
  if (local_168 != &local_158) {
    operator_delete(local_168,CONCAT71(uStack_157,local_158) + 1);
  }
  return;
}

Assistant:

void write(T value) noexcept {
            static_assert(std::is_arithmetic_v<T>);
            std::string result;
            from_num(result, value);
            buffer_.insert(buffer_.end(), result.begin(), result.end());
        }